

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtmelSWISimulationDataGenerator.cpp
# Opt level: O0

void __thiscall
AtmelSWISimulationDataGenerator::OutputTokenZero(AtmelSWISimulationDataGenerator *this)

{
  int iVar1;
  AtmelSWISimulationDataGenerator *this_local;
  
  SimulationChannelDescriptor::Transition();
  iVar1 = (int)this;
  ClockGenerator::AdvanceByTimeS(4.34e-06);
  SimulationChannelDescriptorGroup::AdvanceAll(iVar1 + 0x18);
  SimulationChannelDescriptor::Transition();
  ClockGenerator::AdvanceByTimeS(4.34e-06);
  SimulationChannelDescriptorGroup::AdvanceAll(iVar1 + 0x18);
  SimulationChannelDescriptor::Transition();
  ClockGenerator::AdvanceByTimeS(4.34e-06);
  SimulationChannelDescriptorGroup::AdvanceAll(iVar1 + 0x18);
  SimulationChannelDescriptor::Transition();
  ClockGenerator::AdvanceByTimeS(2.6e-05);
  SimulationChannelDescriptorGroup::AdvanceAll(iVar1 + 0x18);
  return;
}

Assistant:

void AtmelSWISimulationDataGenerator::OutputTokenZero()
{
    mSDA->Transition(); // to low
    mSWISimulationChannels.AdvanceAll( mClockGenerator.AdvanceByTimeS( MICRO_SEC * 4.34 ) );
    mSDA->Transition(); // to high
    mSWISimulationChannels.AdvanceAll( mClockGenerator.AdvanceByTimeS( MICRO_SEC * 4.34 ) );
    mSDA->Transition(); // to low
    mSWISimulationChannels.AdvanceAll( mClockGenerator.AdvanceByTimeS( MICRO_SEC * 4.34 ) );
    mSDA->Transition(); // to high
    mSWISimulationChannels.AdvanceAll( mClockGenerator.AdvanceByTimeS( MICRO_SEC * 26 ) );
}